

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

uint __thiscall Assimp::FBX::FBXConverter::ConvertVideo(FBXConverter *this,Video *video)

{
  bool bVar1;
  aiTexture *this_00;
  uint64_t uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  size_type *__dest;
  void *__src;
  size_t __n;
  aiString *this_01;
  char *sz;
  size_type sVar5;
  string *local_70;
  undefined1 local_48 [8];
  string ext;
  string *filename;
  aiTexture *out_tex;
  Video *video_local;
  FBXConverter *this_local;
  
  out_tex = (aiTexture *)video;
  video_local = (Video *)this;
  this_00 = (aiTexture *)operator_new(0x428);
  aiTexture::aiTexture(this_00);
  filename = (string *)this_00;
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back
            (&this->textures,(value_type *)&filename);
  uVar2 = Video::ContentLength((Video *)out_tex);
  *(int *)filename = (int)uVar2;
  *(undefined4 *)&filename->field_0x4 = 0;
  puVar3 = Video::RelinquishContent((Video *)out_tex);
  *(uint8_t **)((long)&filename->field_2 + 8) = puVar3;
  Video::RelativeFilename_abi_cxx11_((Video *)out_tex);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_70 = Video::RelativeFilename_abi_cxx11_((Video *)out_tex);
  }
  else {
    local_70 = Video::FileName_abi_cxx11_((Video *)out_tex);
  }
  ext.field_2._8_8_ = local_70;
  BaseImporter::GetExtension((string *)local_48,local_70);
  bVar1 = std::operator==((string *)local_48,"jpeg");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_48,"jpg");
  }
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 4) {
    __dest = &filename->_M_string_length;
    __src = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    memcpy(__dest,__src,__n);
  }
  this_01 = (aiString *)(filename + 1);
  sz = (char *)std::__cxx11::string::c_str();
  aiString::Set(this_01,sz);
  sVar5 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->textures);
  std::__cxx11::string::~string((string *)local_48);
  return (int)sVar5 - 1;
}

Assistant:

unsigned int FBXConverter::ConvertVideo(const Video& video)
        {
            // generate empty output texture
            aiTexture* out_tex = new aiTexture();
            textures.push_back(out_tex);

            // assuming the texture is compressed
            out_tex->mWidth = static_cast<unsigned int>(video.ContentLength()); // total data size
            out_tex->mHeight = 0; // fixed to 0

            // steal the data from the Video to avoid an additional copy
            out_tex->pcData = reinterpret_cast<aiTexel*>(const_cast<Video&>(video).RelinquishContent());

            // try to extract a hint from the file extension
            const std::string& filename = video.RelativeFilename().empty() ? video.FileName() : video.RelativeFilename();
            std::string ext = BaseImporter::GetExtension(filename);

            if (ext == "jpeg") {
                ext = "jpg";
            }

            if (ext.size() <= 3) {
                memcpy(out_tex->achFormatHint, ext.c_str(), ext.size());
            }

            out_tex->mFilename.Set(filename.c_str());

            return static_cast<unsigned int>(textures.size() - 1);
        }